

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_delta.c
# Opt level: O0

void test_delta_modify_two_sections(void)

{
  int iVar1;
  
  cunit_start_test("test_delta_modify_two_sections");
  handler_1.cb_delta_handler = handler_modify_two_sections;
  cfg_db_set_entry_ext(db_pre,"type_1","name_1","key_1",value_1.value,1,1);
  cfg_db_set_entry_ext(db_pre,"type_1","name_1","key_2",value_2.value,1,1);
  cfg_db_set_entry_ext(db_pre,"type_1","name_2","key_2",value_2.value,1,1);
  cfg_db_set_entry_ext(db_pre,"type_1","name_2","key_3",value_3.value,1,1);
  cfg_db_set_entry_ext(db_post,"type_1","name_1","key_1",value_2.value,1,1);
  cfg_db_set_entry_ext(db_post,"type_1","name_1","key_2",value_3.value,1,1);
  cfg_db_set_entry_ext(db_post,"type_1","name_2","key_2",value_1.value,1,1);
  cfg_db_set_entry_ext(db_post,"type_1","name_2","key_3",value_2.value,1,1);
  iVar1 = cfg_schema_handle_db_changes(db_pre,db_post);
  cunit_named_check(iVar1 == 0,"test_delta_modify_two_sections",0x1af,"delta calculation failed");
  cunit_named_check(callback_counter == 2,"test_delta_modify_two_sections",0x1b1,
                    "Callback counter was called %d times",(ulong)callback_counter);
  cunit_end_test("test_delta_modify_two_sections");
  return;
}

Assistant:

static void
test_delta_modify_two_sections(void) {
  START_TEST();

  handler_1.cb_delta_handler = handler_modify_two_sections;

  cfg_db_add_entry(db_pre, SECTION_TYPE_1, NAME_1, KEY_1, value_1.value);
  cfg_db_add_entry(db_pre, SECTION_TYPE_1, NAME_1, KEY_2, value_2.value);

  cfg_db_add_entry(db_pre, SECTION_TYPE_1, NAME_2, KEY_2, value_2.value);
  cfg_db_add_entry(db_pre, SECTION_TYPE_1, NAME_2, KEY_3, value_3.value);

  cfg_db_add_entry(db_post, SECTION_TYPE_1, NAME_1, KEY_1, value_2.value);
  cfg_db_add_entry(db_post, SECTION_TYPE_1, NAME_1, KEY_2, value_3.value);

  cfg_db_add_entry(db_post, SECTION_TYPE_1, NAME_2, KEY_2, value_1.value);
  cfg_db_add_entry(db_post, SECTION_TYPE_1, NAME_2, KEY_3, value_2.value);

  CHECK_TRUE(cfg_schema_handle_db_changes(db_pre, db_post) == 0,
      "delta calculation failed");

  CHECK_TRUE(callback_counter == 2, "Callback counter was called %d times", callback_counter);
  END_TEST();
}